

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexFS.hpp
# Opt level: O3

int webfront::fs::IndexFS::open(char *__file,int __oflag,...)

{
  int iVar1;
  span<const_unsigned_long,_18446744073709551615UL> input;
  span<const_unsigned_long,_18446744073709551615UL> input_00;
  span<const_unsigned_long,_18446744073709551615UL> input_01;
  string_view contentEncoding;
  string_view contentEncoding_00;
  string_view contentEncoding_01;
  string filename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  File local_270;
  
  std::filesystem::__cxx11::path::relative_path();
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_290,local_270._0_8_,(long)local_270.data._M_ptr + local_270._0_8_);
  http::std::filesystem::__cxx11::path::~path((path *)&local_270);
  iVar1 = http::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          compare(&local_290,"index.html");
  if (iVar1 == 0) {
    input._M_extent._M_extent_value = 9;
    input._M_ptr = IndexHtml::data._M_elems;
    contentEncoding._M_str = "br";
    contentEncoding._M_len = 2;
    File::File(&local_270,input,0x45,contentEncoding);
    http::std::_Optional_payload_base<webfront::fs::File>::_Storage<webfront::fs::File,_false>::
    _Storage<webfront::fs::File>((_Storage<webfront::fs::File,_false> *)__file,&local_270);
  }
  else {
    iVar1 = http::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare(&local_290,"favicon.ico");
    if (iVar1 == 0) {
      input_00._M_extent._M_extent_value = 0x43;
      input_00._M_ptr = WebFrontIco::data._M_elems;
      contentEncoding_00._M_str = "br";
      contentEncoding_00._M_len = 2;
      File::File(&local_270,input_00,0x210,contentEncoding_00);
      http::std::_Optional_payload_base<webfront::fs::File>::_Storage<webfront::fs::File,_false>::
      _Storage<webfront::fs::File>((_Storage<webfront::fs::File,_false> *)__file,&local_270);
    }
    else {
      iVar1 = http::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
              ::compare(&local_290,"WebFront.js");
      if (iVar1 != 0) {
        __file[600] = '\0';
        goto LAB_001148de;
      }
      input_01._M_extent._M_extent_value = 0x1b6;
      input_01._M_ptr = WebFrontJs::data._M_elems;
      contentEncoding_01._M_str = "gzip";
      contentEncoding_01._M_len = 4;
      File::File(&local_270,input_01,0xdad,contentEncoding_01);
      http::std::_Optional_payload_base<webfront::fs::File>::_Storage<webfront::fs::File,_false>::
      _Storage<webfront::fs::File>((_Storage<webfront::fs::File,_false> *)__file,&local_270);
    }
  }
  __file[600] = '\x01';
  std::ifstream::~ifstream(&local_270.fstream);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.encoding._M_dataplus._M_p != &local_270.encoding.field_2) {
    operator_delete(local_270.encoding._M_dataplus._M_p,
                    local_270.encoding.field_2._M_allocated_capacity + 1);
  }
LAB_001148de:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  return (int)__file;
}

Assistant:

static std::optional<File> open(std::filesystem::path file) {
        auto filename = file.relative_path().string();
        if (filename == "index.html") return File(IndexHtml{});
        if (filename == "favicon.ico") return File{WebFrontIco{}};
        if (filename == "WebFront.js") return File{WebFrontJs{}};
        return {};
    }